

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

match_t * clipp::detail::longest_prefix_match<clipp::detail::select_all>
                    (match_t *__return_storage_ptr__,scoped_dfs_traverser *pos,arg_string *arg,
                    select_all *select)

{
  pointer pcVar1;
  child_t<clipp::parameter,_clipp::group> *this;
  subrange sVar2;
  match_t longest;
  arg_string local_330;
  arg_string local_310;
  match_t local_2f0;
  scoped_dfs_traverser local_230;
  scoped_dfs_traverser local_190;
  match_t local_f0;
  
  match_t::match_t(&local_2f0);
  do {
    pcVar1 = (pos->pos_).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((pos->pos_).stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start == pcVar1) {
      match_t::match_t(__return_storage_ptr__,&local_2f0);
LAB_0010d258:
      match_t::~match_t(&local_2f0);
      return __return_storage_ptr__;
    }
    this = pcVar1[-1].cur._M_current;
    if (this->type_ == param) {
      sVar2 = parameter::match((parameter *)this,arg);
      if (sVar2.at_ == 0) {
        if (sVar2.length_ == arg->_M_string_length) {
          std::__cxx11::string::string((string *)&local_330,(string *)arg);
          scoped_dfs_traverser::scoped_dfs_traverser(&local_230,pos);
          match_t::match_t(__return_storage_ptr__,&local_330,&local_230);
          scoped_dfs_traverser::~scoped_dfs_traverser(&local_230);
          std::__cxx11::string::~string((string *)&local_330);
          goto LAB_0010d258;
        }
        if (local_2f0.str_._M_string_length < sVar2.length_) {
          std::__cxx11::string::substr((ulong)&local_310,(ulong)arg);
          scoped_dfs_traverser::scoped_dfs_traverser(&local_190,pos);
          match_t::match_t(&local_f0,&local_310,&local_190);
          match_t::operator=(&local_2f0,&local_f0);
          match_t::~match_t(&local_f0);
          scoped_dfs_traverser::~scoped_dfs_traverser(&local_190);
          std::__cxx11::string::~string((string *)&local_310);
        }
      }
    }
    scoped_dfs_traverser::operator++(pos);
  } while( true );
}

Assistant:

match_t
longest_prefix_match(scoped_dfs_traverser pos, const arg_string& arg,
                     const ParamSelector& select)
{
    match_t longest;

    while(pos) {
        if(pos->is_param()) {
            const auto& param = pos->as_param();
            if(select(param)) {
                auto match = param.match(arg);
                if(match.prefix()) {
                    if(match.length() == arg.size()) {
                        return match_t{arg, std::move(pos)};
                    }
                    else if(match.length() > longest.length()) {
                        longest = match_t{arg.substr(match.at(), match.length()), 
                                          pos};
                    }
                }
            }
        }
        ++pos;
    }
    return longest;
}